

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O3

ImVector_ImFontConfig *
ImVector_ImFontConfig_ImVector_ImFontConfigVector(ImVector_ImFontConfig *src)

{
  uint uVar1;
  ImVector_ImFontConfig *pIVar2;
  ImFontConfig *__dest;
  ulong uVar3;
  
  pIVar2 = (ImVector_ImFontConfig *)ImGui::MemAlloc(0x10);
  pIVar2->Size = 0;
  pIVar2->Capacity = 0;
  pIVar2->Data = (ImFontConfig *)0x0;
  uVar1 = src->Size;
  if ((long)(int)uVar1 < 1) {
    __dest = (ImFontConfig *)0x0;
  }
  else {
    uVar3 = 8;
    if (8 < uVar1) {
      uVar3 = (ulong)uVar1;
    }
    __dest = (ImFontConfig *)ImGui::MemAlloc(uVar3 * 0x88);
    if (pIVar2->Data != (ImFontConfig *)0x0) {
      memcpy(__dest,pIVar2->Data,(long)pIVar2->Size * 0x88);
      ImGui::MemFree(pIVar2->Data);
    }
    pIVar2->Data = __dest;
    pIVar2->Capacity = (int)uVar3;
  }
  pIVar2->Size = uVar1;
  memcpy(__dest,src->Data,(long)(int)uVar1 * 0x88);
  return pIVar2;
}

Assistant:

CIMGUI_API ImVector_ImFontConfig* ImVector_ImFontConfig_ImVector_ImFontConfigVector(const ImVector_ImFontConfig src)
{
    return IM_NEW(ImVector_ImFontConfig)(src);
}